

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<std::complex<float>,_1000>::Resize
          (TPZManVector<std::complex<float>,_1000> *this,int64_t newsize,complex<float> *object)

{
  complex<float> *pcVar1;
  _ComplexT _Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  complex<float> *pcVar5;
  long lVar6;
  long lVar7;
  int64_t i;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar8 = (this->super_TPZVec<std::complex<float>_>).fNElements;
  if (lVar8 != newsize) {
    lVar6 = (this->super_TPZVec<std::complex<float>_>).fNAlloc;
    if (lVar6 < newsize) {
      if (newsize < 0x3e9) {
        if (lVar8 < 1) {
          lVar8 = 0;
        }
        else {
          pcVar5 = (this->super_TPZVec<std::complex<float>_>).fStore;
          lVar6 = 0;
          do {
            this->fExtAlloc[lVar6]._M_value = pcVar5[lVar6]._M_value;
            lVar6 = lVar6 + 1;
          } while (lVar8 != lVar6);
        }
        if (lVar8 < newsize) {
          do {
            this->fExtAlloc[lVar8]._M_value = object->_M_value;
            lVar8 = lVar8 + 1;
          } while (newsize != lVar8);
        }
        pcVar5 = (this->super_TPZVec<std::complex<float>_>).fStore;
        if (pcVar5 != (complex<float> *)0x0 && pcVar5 != this->fExtAlloc) {
          operator_delete__(pcVar5);
        }
        (this->super_TPZVec<std::complex<float>_>).fStore = this->fExtAlloc;
        (this->super_TPZVec<std::complex<float>_>).fNElements = newsize;
        (this->super_TPZVec<std::complex<float>_>).fNAlloc = 1000;
      }
      else {
        dVar12 = (double)lVar6 * 1.2;
        uVar10 = (long)dVar12;
        if (dVar12 < (double)newsize) {
          uVar10 = newsize;
        }
        pcVar5 = (complex<float> *)operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 * 8);
        if (uVar10 != 0) {
          memset(pcVar5,0,uVar10 * 8);
        }
        if (lVar8 < 1) {
          lVar8 = 0;
        }
        else {
          pcVar1 = (this->super_TPZVec<std::complex<float>_>).fStore;
          lVar6 = 0;
          do {
            pcVar5[lVar6]._M_value = pcVar1[lVar6]._M_value;
            lVar6 = lVar6 + 1;
          } while (lVar8 != lVar6);
        }
        auVar4 = _DAT_014f8350;
        auVar3 = _DAT_014f8340;
        lVar6 = newsize - lVar8;
        if (lVar6 != 0 && lVar8 <= newsize) {
          _Var2 = object->_M_value;
          lVar7 = lVar6 + -1;
          auVar11._8_4_ = (int)lVar7;
          auVar11._0_8_ = lVar7;
          auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
          uVar9 = 0;
          auVar11 = auVar11 ^ _DAT_014f8350;
          do {
            auVar13._8_4_ = (int)uVar9;
            auVar13._0_8_ = uVar9;
            auVar13._12_4_ = (int)(uVar9 >> 0x20);
            auVar13 = (auVar13 | auVar3) ^ auVar4;
            if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                        auVar11._4_4_ < auVar13._4_4_) & 1)) {
              pcVar5[lVar8 + uVar9]._M_value = _Var2;
            }
            if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
                auVar13._12_4_ <= auVar11._12_4_) {
              pcVar5[lVar8 + uVar9 + 1]._M_value = _Var2;
            }
            uVar9 = uVar9 + 2;
          } while ((lVar6 + 1U & 0xfffffffffffffffe) != uVar9);
        }
        pcVar1 = (this->super_TPZVec<std::complex<float>_>).fStore;
        if (pcVar1 != (complex<float> *)0x0 && pcVar1 != this->fExtAlloc) {
          operator_delete__(pcVar1);
        }
        (this->super_TPZVec<std::complex<float>_>).fStore = pcVar5;
        (this->super_TPZVec<std::complex<float>_>).fNElements = newsize;
        (this->super_TPZVec<std::complex<float>_>).fNAlloc = uVar10;
      }
    }
    else {
      if (lVar8 < newsize) {
        do {
          (this->super_TPZVec<std::complex<float>_>).fStore[lVar8]._M_value = object->_M_value;
          lVar8 = lVar8 + 1;
        } while (newsize != lVar8);
      }
      (this->super_TPZVec<std::complex<float>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}